

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.cc
# Opt level: O0

void __thiscall muduo::FileUtil::AppendFile::append(AppendFile *this,char *logline,size_t len)

{
  FILE *__stream;
  int iVar1;
  ssize_t sVar2;
  char *pcVar3;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  AppendFile *in_RDI;
  int err;
  size_t x;
  size_t remain;
  size_t n;
  void *local_28;
  long local_20;
  
  local_20 = write(in_RDI,in_ESI,in_RDX,in_RCX);
  do {
    local_28 = (void *)((long)in_RDX - local_20);
    if (local_28 == (void *)0x0) {
LAB_00144ceb:
      in_RDI->writtenBytes_ = (long)in_RDX + in_RDI->writtenBytes_;
      return;
    }
    sVar2 = write(in_RDI,in_ESI + (int)local_20,local_28,in_RCX);
    if (sVar2 == 0) {
      iVar1 = ferror((FILE *)in_RDI->fp_);
      __stream = _stderr;
      if (iVar1 != 0) {
        pcVar3 = strerror_tl(0);
        fprintf(__stream,"AppendFile::append() failed %s\n",pcVar3);
      }
      goto LAB_00144ceb;
    }
    local_20 = sVar2 + local_20;
  } while( true );
}

Assistant:

void FileUtil::AppendFile::append(const char* logline, const size_t len)
{
  size_t n = write(logline, len);
  size_t remain = len - n;
  while (remain > 0)
  {
    size_t x = write(logline + n, remain);
    if (x == 0)
    {
      int err = ferror(fp_);
      if (err)
      {
        fprintf(stderr, "AppendFile::append() failed %s\n", strerror_tl(err));
      }
      break;
    }
    n += x;
    remain = len - n; // remain -= x
  }

  writtenBytes_ += len;
}